

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O2

size_t ZSTD_estimateCStreamSize_usingCCtxParams(ZSTD_CCtx_params *params)

{
  ZSTD_useRowMatchFinderMode_e useRowMatchFinder;
  ulong uVar1;
  ulong uVar2;
  size_t buffInSize;
  size_t sVar3;
  ZSTD_compressionParameters cParams;
  
  if (0 < params->nbWorkers) {
    return 0xffffffffffffffff;
  }
  sVar3 = 0;
  ZSTD_getCParamsFromCCtxParams(&cParams,params,0xffffffffffffffff,0,ZSTD_cpm_noAttachDict);
  uVar2 = 1L << ((byte)cParams.windowLog & 0x3f);
  uVar1 = 0x20000;
  if (uVar2 < 0x20000) {
    uVar1 = uVar2;
  }
  buffInSize = uVar2 + uVar1;
  if (params->inBufferMode != ZSTD_bm_buffered) {
    buffInSize = sVar3;
  }
  if (params->outBufferMode == ZSTD_bm_buffered) {
    uVar2 = 0;
    if (cParams.windowLog < 0x11) {
      uVar2 = (ulong)(0x20000U - (int)uVar1 >> 0xb);
    }
    sVar3 = uVar2 + (uVar1 >> 8) + uVar1 + 1;
  }
  useRowMatchFinder = ZSTD_resolveRowMatchFinderMode(params->useRowMatchFinder,&params->cParams);
  sVar3 = ZSTD_estimateCCtxSize_usingCCtxParams_internal
                    (&cParams,&params->ldmParams,1,useRowMatchFinder,buffInSize,sVar3,
                     0xffffffffffffffff);
  return sVar3;
}

Assistant:

size_t ZSTD_estimateCStreamSize_usingCCtxParams(const ZSTD_CCtx_params* params)
{
    RETURN_ERROR_IF(params->nbWorkers > 0, GENERIC, "Estimate CCtx size is supported for single-threaded compression only.");
    {   ZSTD_compressionParameters const cParams =
                ZSTD_getCParamsFromCCtxParams(params, ZSTD_CONTENTSIZE_UNKNOWN, 0, ZSTD_cpm_noAttachDict);
        size_t const blockSize = MIN(ZSTD_BLOCKSIZE_MAX, (size_t)1 << cParams.windowLog);
        size_t const inBuffSize = (params->inBufferMode == ZSTD_bm_buffered)
                ? ((size_t)1 << cParams.windowLog) + blockSize
                : 0;
        size_t const outBuffSize = (params->outBufferMode == ZSTD_bm_buffered)
                ? ZSTD_compressBound(blockSize) + 1
                : 0;
        ZSTD_useRowMatchFinderMode_e const useRowMatchFinder = ZSTD_resolveRowMatchFinderMode(params->useRowMatchFinder, &params->cParams);

        return ZSTD_estimateCCtxSize_usingCCtxParams_internal(
            &cParams, &params->ldmParams, 1, useRowMatchFinder, inBuffSize, outBuffSize,
            ZSTD_CONTENTSIZE_UNKNOWN);
    }
}